

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

int mbedtls_mpi_core_write_le(mbedtls_mpi_uint *A,size_t A_limbs,uchar *output,size_t output_length)

{
  size_t __n;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  size_t sVar6;
  size_t i;
  ulong uVar7;
  
  uVar3 = A_limbs * 8;
  uVar1 = uVar3;
  if (uVar3 < output_length) {
LAB_01b82404:
    bVar5 = 0;
    for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
      output[uVar7] = (uchar)(*(ulong *)((long)A + (uVar7 & 0xfffffffffffffff8)) >> (bVar5 & 0x38));
      bVar5 = bVar5 + 8;
    }
    iVar2 = 0;
    __n = output_length + A_limbs * -8;
    if (uVar3 <= output_length && __n != 0) {
      iVar2 = 0;
      switchD_016d4fed::default(output + uVar3,0,__n);
    }
  }
  else {
    lVar4 = output_length * 8;
    iVar2 = -8;
    sVar6 = output_length;
    do {
      uVar1 = output_length;
      if (uVar3 == sVar6) goto LAB_01b82404;
      uVar1 = sVar6 & 0xfffffffffffffff8;
      bVar5 = (byte)lVar4;
      sVar6 = sVar6 + 1;
      lVar4 = lVar4 + 8;
    } while ((char)(*(ulong *)((long)A + uVar1) >> (bVar5 & 0x38)) == '\0');
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_core_write_le(const mbedtls_mpi_uint *A,
                              size_t A_limbs,
                              unsigned char *output,
                              size_t output_length)
{
    size_t stored_bytes = A_limbs * ciL;
    size_t bytes_to_copy;

    if (stored_bytes < output_length) {
        bytes_to_copy = stored_bytes;
    } else {
        bytes_to_copy = output_length;

        /* The output buffer is smaller than the allocated size of A.
         * However A may fit if its leading bytes are zero. */
        for (size_t i = bytes_to_copy; i < stored_bytes; i++) {
            if (GET_BYTE(A, i) != 0) {
                return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
            }
        }
    }

    for (size_t i = 0; i < bytes_to_copy; i++) {
        output[i] = GET_BYTE(A, i);
    }

    if (stored_bytes < output_length) {
        /* Write trailing 0 bytes */
        memset(output + stored_bytes, 0, output_length - stored_bytes);
    }

    return 0;
}